

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

void __thiscall QFileDialog::done(QFileDialog *this,int result)

{
  long lVar1;
  bool bVar2;
  char *pcVar3;
  QObject *pQVar4;
  char *pcVar5;
  
  lVar1 = *(long *)&(this->super_QDialog).super_QWidget.field_0x8;
  QDialog::done(&this->super_QDialog,result);
  bVar2 = QPointer::operator_cast_to_bool((QPointer *)(lVar1 + 0x390));
  if (bVar2) {
    pcVar5 = *(char **)(lVar1 + 0x3c0);
    if (pcVar5 == (char *)0x0) {
      pcVar5 = (char *)&QByteArray::_empty;
    }
    if ((*(long *)(lVar1 + 0x390) == 0) || (*(int *)(*(long *)(lVar1 + 0x390) + 4) == 0)) {
      pQVar4 = (QObject *)0x0;
    }
    else {
      pQVar4 = *(QObject **)(lVar1 + 0x398);
    }
    pcVar3 = *(char **)(lVar1 + 0x3a8);
    if (pcVar3 == (char *)0x0) {
      pcVar3 = (char *)&QByteArray::_empty;
    }
    QObject::disconnect((QObject *)this,pcVar5,pQVar4,pcVar3);
    QWeakPointer<QObject>::assign<QObject>((QWeakPointer<QObject> *)(lVar1 + 0x390),(QObject *)0x0);
  }
  QByteArray::clear();
  QByteArray::clear();
  return;
}

Assistant:

void QFileDialog::done(int result)
{
    Q_D(QFileDialog);

    QDialog::done(result);

    if (d->receiverToDisconnectOnClose) {
        disconnect(this, d->signalToDisconnectOnClose,
                   d->receiverToDisconnectOnClose, d->memberToDisconnectOnClose);
        d->receiverToDisconnectOnClose = nullptr;
    }
    d->memberToDisconnectOnClose.clear();
    d->signalToDisconnectOnClose.clear();
}